

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obsolete_vertex_with_color.c
# Opt level: O3

bool_t prf_obsolete_vertex_with_color_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  uint16_t uVar1;
  ushort uVar2;
  int32_t iVar3;
  int32_t *piVar4;
  uint len;
  bool_t bVar5;
  uint uVar6;
  
  uVar1 = bf_get_uint16_be(bfile);
  node->opcode = uVar1;
  if (uVar1 == prf_obsolete_vertex_with_color_info.opcode) {
    uVar2 = bf_get_uint16_be(bfile);
    node->length = uVar2;
    uVar6 = 4;
    if (4 < uVar2) {
      piVar4 = (int32_t *)node->data;
      if (piVar4 == (int32_t *)0x0) {
        pool_id = state->model->mempool_id;
        if (pool_id == 0) {
          piVar4 = (int32_t *)malloc((ulong)(uVar2 - 4));
        }
        else {
          piVar4 = (int32_t *)pool_malloc(pool_id,uVar2 - 4);
        }
        node->data = (uint8_t *)piVar4;
        if (piVar4 == (int32_t *)0x0) {
          prf_error(9,"memory allocation problem (returned NULL)");
          uVar6 = 4;
          goto LAB_001093f8;
        }
        uVar2 = node->length;
      }
      if (7 < uVar2) {
        iVar3 = bf_get_int32_be(bfile);
        *piVar4 = iVar3;
        uVar2 = node->length;
        uVar6 = 8;
        if (0xb < uVar2) {
          iVar3 = bf_get_int32_be(bfile);
          piVar4[1] = iVar3;
          uVar2 = node->length;
          uVar6 = 0xc;
          if (0xf < uVar2) {
            iVar3 = bf_get_int32_be(bfile);
            piVar4[2] = iVar3;
            uVar2 = node->length;
            uVar6 = 0x10;
          }
        }
      }
    }
    bVar5 = 1;
    len = uVar2 - uVar6;
    if (uVar6 <= uVar2 && len != 0) {
      bf_read(bfile,node->data + ((ulong)uVar6 - 4),len);
    }
  }
  else {
    prf_error(9,"tried vertex with color (obs) load method for node of type %d.",(ulong)uVar1);
    uVar6 = 2;
LAB_001093f8:
    bVar5 = 0;
    bf_rewind(bfile,uVar6);
  }
  return bVar5;
}

Assistant:

static
bool_t
prf_obsolete_vertex_with_color_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos = 4;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_obsolete_vertex_with_color_info.opcode ) {
        prf_error( 9,
            "tried vertex with color (obs) load method for node of type %d.",
            node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );
    if ( node->length > 4 && node->data == NULL ) { /* not preallocated */
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    do {
        node_data * data;
        data = (node_data *) node->data;

        if ( node->length < (pos + 4) ) break;
        data->x = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->y = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->z = bf_get_int32_be( bfile ); pos += 4;
    } while ( FALSE );

    if ( pos < node->length )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}